

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::construct(token<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
            *this,token<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  *other)

{
  half_storage *in_RSI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  (in_RDI->field_0).half_float_ = *in_RSI;
  switch((in_RDI->field_0).half_float_) {
  case (half_storage)0x2:
    std::
    unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
    ::unique_ptr((unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                  *)in_RDI,
                 (unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                  *)in_stack_ffffffffffffffd8);
    break;
  default:
    break;
  case (half_storage)0xd:
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_RDI,in_stack_ffffffffffffffd8);
    break;
  case (half_storage)0xe:
    (in_RDI->field_0).int64_.val_ = *(int64_t *)(in_RSI + 2);
    break;
  case (half_storage)0xf:
    (in_RDI->field_0).int64_.val_ = *(int64_t *)(in_RSI + 2);
    break;
  case (half_storage)0x12:
    (in_RDI->field_0).int64_.val_ = *(int64_t *)(in_RSI + 2);
    break;
  case (half_storage)0x13:
    (in_RDI->field_0).int64_.val_ = *(int64_t *)(in_RSI + 2);
  }
  return;
}

Assistant:

void construct(token&& other) noexcept
        {
            token_kind_ = other.token_kind_;
            switch (token_kind_)
            {
                case jsonpath_token_kind::selector:
                    selector_ = other.selector_;
                    break;
                case jsonpath_token_kind::expression:
                    new (&expression_) std::unique_ptr<expression_base_type>(std::move(other.expression_));
                    break;
                case jsonpath_token_kind::unary_operator:
                    unary_operator_ = other.unary_operator_;
                    break;
                case jsonpath_token_kind::binary_operator:
                    binary_operator_ = other.binary_operator_;
                    break;
                case jsonpath_token_kind::function:
                    function_ = other.function_;
                    break;
                case jsonpath_token_kind::literal:
                    new (&value_) Json(std::move(other.value_));
                    break;
                default:
                    break;
            }
        }